

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darLib.c
# Opt level: O0

Aig_Obj_t * Dar_LibBuildBest_rec(Dar_Man_t *p,Dar_LibObj_t *pObj)

{
  Dar_LibDat_t *pDVar1;
  Dar_LibObj_t *pDVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Dar_LibDat_t *pData;
  Aig_Obj_t *pFanin1;
  Aig_Obj_t *pFanin0;
  Dar_LibObj_t *pObj_local;
  Dar_Man_t *p_local;
  
  pDVar1 = s_DarLib->pDatas + (int)(SUB84(*pObj,4) >> 4);
  if ((pDVar1->field_0).pFunc == (Aig_Obj_t *)0x0) {
    pDVar2 = Dar_LibObj(s_DarLib,SUB84(*pObj,0) & 0xffff);
    pAVar3 = Dar_LibBuildBest_rec(p,pDVar2);
    pDVar2 = Dar_LibObj(s_DarLib,SUB84(*pObj,2) & 0xffff);
    pAVar4 = Dar_LibBuildBest_rec(p,pDVar2);
    pAVar3 = Aig_NotCond(pAVar3,SUB84(*pObj,4) & 1);
    pAVar4 = Aig_NotCond(pAVar4,SUB84(*pObj,4) >> 1 & 1);
    pAVar3 = Aig_And(p->pAig,pAVar3,pAVar4);
    (pDVar1->field_0).pFunc = pAVar3;
    p_local = (Dar_Man_t *)(pDVar1->field_0).pFunc;
  }
  else {
    p_local = (Dar_Man_t *)(pDVar1->field_0).pFunc;
  }
  return (Aig_Obj_t *)p_local;
}

Assistant:

Aig_Obj_t * Dar_LibBuildBest_rec( Dar_Man_t * p, Dar_LibObj_t * pObj )
{
    Aig_Obj_t * pFanin0, * pFanin1;
    Dar_LibDat_t * pData = s_DarLib->pDatas + pObj->Num;
    if ( pData->pFunc )
        return pData->pFunc;
    pFanin0 = Dar_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan0) );
    pFanin1 = Dar_LibBuildBest_rec( p, Dar_LibObj(s_DarLib, pObj->Fan1) );
    pFanin0 = Aig_NotCond( pFanin0, pObj->fCompl0 );
    pFanin1 = Aig_NotCond( pFanin1, pObj->fCompl1 );
    pData->pFunc = Aig_And( p->pAig, pFanin0, pFanin1 );
//    assert( pData->Level == (int)Aig_Regular(pData->pFunc)->Level );
    return pData->pFunc;
}